

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O3

int do_bind(char *host,int port,int protocol,int *family)

{
  int iVar1;
  int iVar2;
  int iVar3;
  addrinfo *ai_list;
  int reuse;
  char portstr [16];
  addrinfo *local_68;
  undefined4 local_5c;
  char local_58 [16];
  addrinfo local_48;
  
  local_5c = 1;
  local_68 = (addrinfo *)0x0;
  if ((host == (char *)0x0) || (*host == '\0')) {
    host = "0.0.0.0";
  }
  sprintf(local_58,"%d",port);
  local_48.ai_flags = 0;
  local_48.ai_family = 0;
  local_48.ai_socktype = 0;
  local_48.ai_protocol = 0;
  local_48.ai_addrlen = 0;
  local_48._20_4_ = 0;
  local_48.ai_addr = (sockaddr *)0x0;
  local_48.ai_canonname = (char *)0x0;
  local_48.ai_next = (addrinfo *)0x0;
  iVar2 = 1;
  if (protocol != 6) {
    if (protocol != 0x11) {
      __assert_fail("protocol == IPPROTO_UDP",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/skynet-src/socket_server.c"
                    ,0x56d,"int do_bind(const char *, int, int, int *)");
    }
    iVar2 = 2;
  }
  local_48.ai_protocol = protocol;
  local_48.ai_socktype = iVar2;
  iVar1 = getaddrinfo(host,local_58,&local_48,&local_68);
  iVar2 = -1;
  if (iVar1 == 0) {
    iVar2 = local_68->ai_family;
    *family = iVar2;
    iVar1 = socket(iVar2,local_68->ai_socktype,0);
    iVar2 = -1;
    if ((-1 < iVar1) &&
       ((iVar2 = setsockopt(iVar1,1,2,&local_5c,4), iVar2 == -1 ||
        (iVar3 = bind(iVar1,local_68->ai_addr,local_68->ai_addrlen), iVar2 = iVar1, iVar3 != 0)))) {
      close(iVar1);
      iVar2 = -1;
    }
    freeaddrinfo(local_68);
  }
  return iVar2;
}

Assistant:

static int
do_bind(const char *host, int port, int protocol, int *family) {
	int fd;
	int status;
	int reuse = 1;
	struct addrinfo ai_hints;
	struct addrinfo *ai_list = NULL;
	char portstr[16];
	if (host == NULL || host[0] == 0) {
		host = "0.0.0.0";	// INADDR_ANY
	}
	sprintf(portstr, "%d", port);
	memset( &ai_hints, 0, sizeof( ai_hints ) );
	ai_hints.ai_family = AF_UNSPEC;
	if (protocol == IPPROTO_TCP) {
		ai_hints.ai_socktype = SOCK_STREAM;
	} else {
		assert(protocol == IPPROTO_UDP);
		ai_hints.ai_socktype = SOCK_DGRAM;
	}
	ai_hints.ai_protocol = protocol;

	status = getaddrinfo( host, portstr, &ai_hints, &ai_list );
	if ( status != 0 ) {
		return -1;
	}
	*family = ai_list->ai_family;
	fd = socket(*family, ai_list->ai_socktype, 0);
	if (fd < 0) {
		goto _failed_fd;
	}
	if (setsockopt(fd, SOL_SOCKET, SO_REUSEADDR, (void *)&reuse, sizeof(int))==-1) {
		goto _failed;
	}
	status = bind(fd, (struct sockaddr *)ai_list->ai_addr, ai_list->ai_addrlen);
	if (status != 0)
		goto _failed;

	freeaddrinfo( ai_list );
	return fd;
_failed:
	close(fd);
_failed_fd:
	freeaddrinfo( ai_list );
	return -1;
}